

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSD.cpp
# Opt level: O0

void findMatch(vector<Descriptor,_std::allocator<Descriptor>_> *keyPointDescriptor1,
              vector<Descriptor,_std::allocator<Descriptor>_> *keyPointDescriptor2,
              vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *keyPoint1,
              vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *keyPoint2,
              vector<cv::DMatch,_std::allocator<cv::DMatch>_> *dMatch,int threshold)

{
  bool bVar1;
  reference pDVar2;
  DMatch local_20c;
  Point2f local_1fc;
  KeyPoint local_1f4;
  Point2f local_1d8;
  KeyPoint local_1d0;
  float local_1b4;
  float ratio;
  Point_<int> local_1a8;
  Point_<int> local_1a0;
  Point_<int> local_198;
  float local_190;
  undefined4 local_18c;
  float dist;
  int local_184;
  Descriptor desp2;
  iterator __end2;
  iterator __begin2;
  vector<Descriptor,_std::allocator<Descriptor>_> *__range2;
  float secondDist;
  Point secondPoint2;
  Point secondPoint1;
  float bestDist;
  Descriptor *bestDesp2;
  Point bestPoint2;
  Point_<int> local_c8;
  Point bestPoint1;
  Descriptor desp1;
  iterator __end1;
  iterator __begin1;
  vector<Descriptor,_std::allocator<Descriptor>_> *__range1;
  int idx;
  int threshold_local;
  vector<cv::DMatch,_std::allocator<cv::DMatch>_> *dMatch_local;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *keyPoint2_local;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *keyPoint1_local;
  vector<Descriptor,_std::allocator<Descriptor>_> *keyPointDescriptor2_local;
  vector<Descriptor,_std::allocator<Descriptor>_> *keyPointDescriptor1_local;
  
  __range1._0_4_ = 0;
  __end1 = std::vector<Descriptor,_std::allocator<Descriptor>_>::begin(keyPointDescriptor1);
  desp1._104_8_ = std::vector<Descriptor,_std::allocator<Descriptor>_>::end(keyPointDescriptor1);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Descriptor_*,_std::vector<Descriptor,_std::allocator<Descriptor>_>_>
                                     *)&desp1.field_0x68), bVar1) {
    pDVar2 = __gnu_cxx::
             __normal_iterator<Descriptor_*,_std::vector<Descriptor,_std::allocator<Descriptor>_>_>
             ::operator*(&__end1);
    Descriptor::Descriptor((Descriptor *)&bestPoint1,pDVar2);
    cv::Point_<int>::Point_(&local_c8);
    cv::Point_<int>::Point_((Point_<int> *)((long)&bestDesp2 + 4));
    stack0xffffffffffffff18 = (float *)0x0;
    secondPoint1.x = (int)std::numeric_limits<float>::max();
    cv::Point_<int>::Point_(&secondPoint2);
    cv::Point_<int>::Point_((Point_<int> *)((long)&__range2 + 4));
    __range2._0_4_ = (float)secondPoint1.x;
    __end2 = std::vector<Descriptor,_std::allocator<Descriptor>_>::begin(keyPointDescriptor2);
    desp2._104_8_ = std::vector<Descriptor,_std::allocator<Descriptor>_>::end(keyPointDescriptor2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Descriptor_*,_std::vector<Descriptor,_std::allocator<Descriptor>_>_>
                                       *)&desp2.field_0x68), bVar1) {
      pDVar2 = __gnu_cxx::
               __normal_iterator<Descriptor_*,_std::vector<Descriptor,_std::allocator<Descriptor>_>_>
               ::operator*(&__end2);
      Descriptor::Descriptor((Descriptor *)&dist,pDVar2);
      if (((byte)desp2.x & 1) == 0) {
        local_190 = getDistance((Mat *)&desp1.isPaired,(Mat *)&desp2.isPaired);
        if ((float)secondPoint1.x <= local_190) {
          if (local_190 < __range2._0_4_) {
            __range2._0_4_ = local_190;
            cv::Point_<int>::Point_(&local_1a8,bestPoint1.x,bestPoint1.y);
            cv::Point_<int>::operator=(&secondPoint2,&local_1a8);
            cv::Point_<int>::Point_((Point_<int> *)&stack0xfffffffffffffe50,(int)dist,local_184);
            cv::Point_<int>::operator=
                      ((Point_<int> *)((long)&__range2 + 4),(Point_<int> *)&stack0xfffffffffffffe50)
            ;
          }
        }
        else {
          __range2._0_4_ = (float)secondPoint1.x;
          cv::Point_<int>::operator=(&secondPoint2,&local_c8);
          cv::Point_<int>::operator=
                    ((Point_<int> *)((long)&__range2 + 4),(Point_<int> *)((long)&bestDesp2 + 4));
          secondPoint1.x = (int)local_190;
          cv::Point_<int>::Point_(&local_198,bestPoint1.x,bestPoint1.y);
          cv::Point_<int>::operator=(&local_c8,&local_198);
          cv::Point_<int>::Point_(&local_1a0,(int)dist,local_184);
          cv::Point_<int>::operator=((Point_<int> *)((long)&bestDesp2 + 4),&local_1a0);
          unique0x00004880 = &dist;
        }
        local_18c = 0;
      }
      else {
        local_18c = 5;
      }
      Descriptor::~Descriptor((Descriptor *)&dist);
      __gnu_cxx::
      __normal_iterator<Descriptor_*,_std::vector<Descriptor,_std::allocator<Descriptor>_>_>::
      operator++(&__end2);
    }
    if ((float)secondPoint1.x <= (float)threshold) {
      local_1b4 = (float)secondPoint1.x / __range2._0_4_;
      if (local_1b4 <= 0.8) {
        cv::Point_::operator_cast_to_Point_((Point_ *)&local_1d8);
        cv::KeyPoint::KeyPoint(&local_1d0,&local_1d8,5.0,-1.0,0.0,0,-1);
        std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::push_back(keyPoint1,&local_1d0);
        cv::Point_::operator_cast_to_Point_((Point_ *)&local_1fc);
        cv::KeyPoint::KeyPoint(&local_1f4,&local_1fc,5.0,-1.0,0.0,0,-1);
        std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::push_back(keyPoint2,&local_1f4);
        cv::DMatch::DMatch(&local_20c,(int)__range1,(int)__range1,3.0);
        std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>::push_back(dMatch,&local_20c);
        __range1._0_4_ = (int)__range1 + 1;
        *(undefined1 *)(stack0xffffffffffffff18 + 2) = 1;
      }
      local_18c = 0;
    }
    else {
      local_18c = 3;
    }
    Descriptor::~Descriptor((Descriptor *)&bestPoint1);
    __gnu_cxx::
    __normal_iterator<Descriptor_*,_std::vector<Descriptor,_std::allocator<Descriptor>_>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void findMatch(vector<Descriptor>& keyPointDescriptor1, vector<Descriptor>& keyPointDescriptor2, vector<KeyPoint>& keyPoint1, vector<KeyPoint>& keyPoint2, vector<DMatch>& dMatch, int threshold) {
	int idx = 0;
	for (Descriptor desp1 : keyPointDescriptor1) {
		Point bestPoint1;
		Point bestPoint2;
		Descriptor* bestDesp2=NULL;
		float bestDist = numeric_limits<float>::max();
		Point secondPoint1;
		Point secondPoint2;
		float secondDist = bestDist;
		for (Descriptor desp2 : keyPointDescriptor2) {
			//skip the keypoint if it has already been paired
			if (desp2.isPaired) continue;

			float dist = getDistance(desp1.v, desp2.v);
			if (dist < bestDist) {
				secondDist = bestDist;
				secondPoint1 = bestPoint1;
				secondPoint2 = bestPoint2;
				bestDist = dist;
				bestPoint1 = Point(desp1.x, desp1.y);
				bestPoint2 = Point(desp2.x, desp2.y);
				bestDesp2 = &desp2;
			}
			else if (dist < secondDist) {
				secondDist = dist;
				secondPoint1 = Point(desp1.x, desp1.y);
				secondPoint2 = Point(desp2.x, desp2.y);
			}
		}
		if (bestDist > threshold) continue;
		float ratio = bestDist / secondDist;
		if (ratio <= 0.8) {
			keyPoint1.push_back(KeyPoint(bestPoint1, 5));
			keyPoint2.push_back(KeyPoint(bestPoint2, 5));
			dMatch.push_back(DMatch(idx, idx, 3));
			++idx;
			(*bestDesp2).isPaired = true;
		}
	}
}